

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.c
# Opt level: O0

void show_map_spot(int x,int y)

{
  int iVar1;
  rm *prVar2;
  rm *loc;
  int y_local;
  int x_local;
  
  if ((u.uprops[0x1c].intrinsic == 0) || (iVar1 = rn2(7), iVar1 == 0)) {
    prVar2 = level->locations[x] + y;
    prVar2->seenv = 0xff;
    if (prVar2->typ == '\x10') {
      prVar2->typ = '\x18';
      unblock_point(x,y);
    }
    if (((*(uint *)prVar2 >> 0xb & 0x3ff) == 0) && ((*(uint *)prVar2 >> 6 & 0x1f) == 0)) {
      if ((*(uint *)&(level->flags).field_0x8 >> 0xe & 1) == 0) {
        magic_map_background((xchar)x,(xchar)y,1);
      }
      else {
        magic_map_background((xchar)x,(xchar)y,0);
        newsym(x,y);
      }
    }
  }
  return;
}

Assistant:

static void show_map_spot(int x, int y)
{
    struct rm *loc;

    if (Confusion && rn2(7)) return;
    loc = &level->locations[x][y];

    loc->seenv = SVALL;

    /* Secret corridors are found, but not secret doors. */
    if (loc->typ == SCORR) {
	loc->typ = CORR;
	unblock_point(x,y);
    }

    /* if we don't remember an object or trap there, map it */
    if (!loc->mem_obj && !loc->mem_trap) {
	if (level->flags.hero_memory) {
	    magic_map_background(x,y,0);
	    newsym(x,y);			/* show it, if not blocked */
	} else {
	    magic_map_background(x,y,1);	/* display it */
	}
    }
}